

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferBlockReferencedByShaderSingleBlockContentCases<(glu::Storage)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               int expandLevel)

{
  Node *ptr;
  StorageQualifier *this;
  InterfaceBlock *pIVar1;
  Variable *pVVar2;
  ResourceTestCase *pRVar3;
  ArrayElement *this_00;
  ProgramResourceQueryTestTarget local_e0;
  undefined1 local_d8 [8];
  SharedPtr dummyVariable_2;
  SharedPtr block_2;
  SharedPtr arrayElement;
  undefined1 local_a0 [8];
  SharedPtr dummyVariable_1;
  SharedPtr block_1;
  undefined1 local_78 [8];
  SharedPtr dummyVariable;
  SharedPtr block;
  SharedPtr storage;
  undefined1 local_38 [8];
  SharedPtr defaultBlock;
  ProgramInterface programInterface;
  int expandLevel_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  defaultBlock.m_state._0_4_ = 7;
  defaultBlock.m_state._4_4_ = expandLevel;
  ptr = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)ptr,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_38,ptr);
  this = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this,(SharedPtr *)local_38,STORAGE_BUFFER);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&block.m_state,(Node *)this);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,(SharedPtr *)&block.m_state,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&dummyVariable.m_state,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar2,(SharedPtr *)&dummyVariable.m_state,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_78,(Node *)pVVar2);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&block_1.m_state,
             PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,(SharedPtr *)local_78,(ProgramResourceQueryTestTarget *)&block_1.m_state
             ,"named_block");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_78);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&dummyVariable.m_state);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,(SharedPtr *)&block.m_state,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&dummyVariable_1.m_state,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable
            (pVVar2,(SharedPtr *)&dummyVariable_1.m_state,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_a0,(Node *)pVVar2);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&arrayElement.m_state,
             PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,(SharedPtr *)local_a0,
             (ProgramResourceQueryTestTarget *)&arrayElement.m_state,"unnamed_block");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_a0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&dummyVariable_1.m_state);
  this_00 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(this_00,(SharedPtr *)&block.m_state,3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&block_2.m_state,(Node *)this_00);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,(SharedPtr *)&block_2.m_state,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&dummyVariable_2.m_state,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable
            (pVVar2,(SharedPtr *)&dummyVariable_2.m_state,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_d8,(Node *)pVVar2);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_e0,PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400);
  ResourceTestCase::ResourceTestCase(pRVar3,context,(SharedPtr *)local_d8,&local_e0,"block_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_d8);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&dummyVariable_2.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&block_2.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&block.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_38);
  return;
}

Assistant:

static void generateBufferBlockReferencedByShaderSingleBlockContentCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, int expandLevel)
{
	const ProgramInterface						programInterface	= (Storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
																      (Storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
																      (PROGRAMINTERFACE_LAST);
	const ResourceDefinition::Node::SharedPtr	defaultBlock		(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	storage				(new ResourceDefinition::StorageQualifier(defaultBlock, Storage));

	DE_UNREF(expandLevel);

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	// .named_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(storage, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "named_block"));
	}

	// .unnamed_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(storage, false));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "unnamed_block"));
	}

	// .block_array
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(storage, 3));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "block_array"));
	}
}